

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FatWalk.cpp
# Opt level: O0

void __thiscall FatWalk::walk(FatWalk *this,int cluster)

{
  allocator<char> local_201;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8 [32];
  undefined1 local_1b8 [8];
  set<int,_std::less<int>,_std::allocator<int>_> visited;
  FatEntry local_178;
  undefined1 local_c8 [8];
  FatEntry root;
  int cluster_local;
  FatWalk *this_local;
  
  root.data.field_2._12_4_ = cluster;
  FatEntry::FatEntry((FatEntry *)local_c8);
  if ((long)(int)root.data.field_2._12_4_ == ((this->super_FatModule).system)->rootDirectory) {
    FatSystem::rootEntry(&local_178,(this->super_FatModule).system);
    FatEntry::operator=((FatEntry *)local_c8,&local_178);
    FatEntry::~FatEntry(&local_178);
  }
  else {
    root.longName.field_2._12_4_ = root.data.field_2._12_4_;
    root.longName.field_2._M_local_buf[8] = '\x10';
    std::__cxx11::string::operator=((string *)(root.shortName.field_2._M_local_buf + 8),"/");
  }
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_1b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1d8,"/",&local_1d9);
  (*this->_vptr_FatWalk[1])(this,local_c8,local_c8,local_1d8);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,"/",&local_201);
  doWalk(this,(set<int,_std::less<int>,_std::allocator<int>_> *)local_1b8,(FatEntry *)local_c8,
         &local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator(&local_201);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_1b8);
  FatEntry::~FatEntry((FatEntry *)local_c8);
  return;
}

Assistant:

void FatWalk::walk(int cluster)
{
    FatEntry root;

    if (cluster == system.rootDirectory) {
        root = system.rootEntry();
    } else {
        root.cluster = cluster;
        root.attributes = FAT_ATTRIBUTES_DIR;
        root.longName = "/";
    }
    set<int> visited;
    onEntry(root, root, "/");
    doWalk(visited, root, "/");
}